

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_HashPLTerm_Test::TestBody(ExprTest_HashPLTerm_Test *this)

{
  Reference arg;
  PLTerm expr;
  size_t sVar1;
  char *message;
  long lVar2;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar;
  size_t local_50;
  double slopes [3];
  double breakpoints [2];
  
  breakpoints[0] = 5.0;
  breakpoints[1] = 10.0;
  slopes[0] = -1.0;
  slopes[1] = 0.0;
  slopes[2] = 1.0;
  sVar1 = 0x9e3779e1;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    sVar1 = mp::internal::HashCombine<double>(sVar1,(double *)((long)slopes + lVar2));
    sVar1 = mp::internal::HashCombine<double>(sVar1,(double *)((long)breakpoints + lVar2));
    local_50 = sVar1;
  }
  sVar1 = mp::internal::HashCombine<double>(sVar1,slopes + 2);
  arg = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                  (&(this->super_ExprTest).factory_,9);
  gtest_ar._0_8_ = arg;
  local_50 = mp::internal::HashCombine<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                       (sVar1,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)&gtest_ar);
  expr = ExprTest::MakePLTerm(&this->super_ExprTest,2,breakpoints,slopes,arg);
  local_68.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                 ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)&local_70,
                  (Expr)expr.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                        impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"hash",
             "ExprHash()( MakePLTerm(NUM_BREAKPOINTS, breakpoints, slopes, var))",&local_50,
             (unsigned_long *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x40b
               ,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprTest, HashPLTerm) {
  size_t hash = HashCombine<int>(0, expr::PLTERM);
  enum {NUM_BREAKPOINTS = 2};
  double breakpoints[NUM_BREAKPOINTS] = {5, 10};
  double slopes[NUM_BREAKPOINTS + 1] = {-1, 0, 1};
  for (size_t i = 0; i < NUM_BREAKPOINTS; ++i) {
    hash = HashCombine(hash, slopes[i]);
    hash = HashCombine(hash, breakpoints[i]);
  }
  hash = HashCombine(hash, slopes[NUM_BREAKPOINTS]);
  auto var = factory_.MakeVariable(9);
  hash = HashCombine<Expr>(hash, var);
  EXPECT_EQ(hash, ExprHash()(
    MakePLTerm(NUM_BREAKPOINTS, breakpoints, slopes, var)));
}